

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::RecordStatementMap(FunctionBody *this,StatementMap *pStatementMap)

{
  code *pcVar1;
  StatementMapList *this_00;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  TrackAllocData local_50;
  StatementMapList *local_28;
  StatementMapList *statementMaps;
  Recycler *recycler;
  StatementMap *pStatementMap_local;
  FunctionBody *this_local;
  
  recycler = (Recycler *)pStatementMap;
  pStatementMap_local = (StatementMap *)this;
  if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x114,"(!this->m_sourceInfo.pSpanSequence)",
                                "!this->m_sourceInfo.pSpanSequence");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  statementMaps =
       (StatementMapList *)
       ScriptContext::GetRecycler
                 ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  local_28 = GetStatementMaps(this);
  this_00 = statementMaps;
  if (local_28 == (StatementMapList *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,
               (type_info *)
               &JsUtil::
                List<Js::FunctionBody::StatementMap*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x119);
    alloc = Memory::Recycler::TrackAllocInfo((Recycler *)this_00,&local_50);
    this_01 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::Recycler>(0x30,alloc,0x43c4b0);
    JsUtil::
    List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_01,(Recycler *)statementMaps,4);
    local_28 = this_01;
    SetStatementMaps(this,this_01);
  }
  JsUtil::
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(local_28,(StatementMap **)&recycler);
  return;
}

Assistant:

void
    FunctionBody::RecordStatementMap(StatementMap* pStatementMap)
    {
        Assert(!this->m_sourceInfo.pSpanSequence);
        Recycler* recycler = this->m_scriptContext->GetRecycler();
        StatementMapList * statementMaps = this->GetStatementMaps();
        if (!statementMaps)
        {
            statementMaps = RecyclerNew(recycler, StatementMapList, recycler);
            this->SetStatementMaps(statementMaps);
        }

        statementMaps->Add(pStatementMap);
    }